

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crail_directory.cc
# Opt level: O2

void __thiscall
CrailDirectory::CrailDirectory
          (CrailDirectory *this,FileInfo *file_info,shared_ptr<NamenodeClient> *namenode_client,
          shared_ptr<StorageCache> *storage_cache,shared_ptr<BlockCache> *block_cache)

{
  __shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2> _Stack_98;
  __shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2> local_78;
  FileInfo local_68;
  
  local_68._vptr_FileInfo = (_func_int **)&PTR__FileInfo_0013c9d8;
  local_68.fd_ = file_info->fd_;
  local_68.capacity_ = file_info->capacity_;
  local_68.node_type_ = file_info->node_type_;
  local_68._28_4_ = *(undefined4 *)&file_info->field_0x1c;
  local_68.dir_offset_ = file_info->dir_offset_;
  local_68.token_ = file_info->token_;
  local_68.modification_time_ = file_info->modification_time_;
  std::__shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &namenode_client->super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&storage_cache->super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_98,&block_cache->super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>);
  CrailNode::CrailNode
            (&this->super_CrailNode,&local_68,(shared_ptr<NamenodeClient> *)&local_78,
             (shared_ptr<StorageCache> *)&local_88,(shared_ptr<BlockCache> *)&_Stack_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_98._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  (this->super_CrailNode)._vptr_CrailNode = (_func_int **)&PTR__CrailDirectory_0013b450;
  return;
}

Assistant:

CrailDirectory::CrailDirectory(FileInfo file_info,
                               shared_ptr<NamenodeClient> namenode_client,
                               shared_ptr<StorageCache> storage_cache,
                               shared_ptr<BlockCache> block_cache)
    : CrailNode(file_info, namenode_client, storage_cache, block_cache) {}